

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-contact-ekf-flex-estimator-imu.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::
setMeasurementNoiseCovariance(FixedContactEKFFlexEstimatorIMU *this,Matrix *R)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  Matrix *R_local;
  FixedContactEKFFlexEstimatorIMU *this_local;
  
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  bVar1 = false;
  if ((int)IVar3 == iVar2) {
    IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&R->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    iVar2 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
              _vptr_FlexibilityEstimatorBase[0x14])();
    bVar1 = false;
    if ((int)IVar3 == iVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("unsigned(R.rows())==getMeasurementSize() && unsigned(R.cols())==getMeasurementSize() && \"ERROR: The measurement noise covariance matrix R has                         incorrect size\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/src/fixed-contact-ekf-flex-estimator-imu.cpp"
                  ,0x9b,
                  "virtual void stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::setMeasurementNoiseCovariance(const Matrix &)"
                 );
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=(&this->R_,R);
  (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
    _vptr_FlexibilityEstimatorBase[0x22])();
  return;
}

Assistant:

void FixedContactEKFFlexEstimatorIMU::setMeasurementNoiseCovariance
                                            (const Matrix & R)
    {
        BOOST_ASSERT(unsigned(R.rows())==getMeasurementSize() &&
                     unsigned(R.cols())==getMeasurementSize() &&
                    "ERROR: The measurement noise covariance matrix R has \
                        incorrect size");

        R_=R;
        updateCovarianceMatrix_();
    }